

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash.cc
# Opt level: O0

void OPENSSL_lh_free(_LHASH *lh)

{
  lhash_item_st *plVar1;
  LHASH_ITEM *local_28;
  LHASH_ITEM *n;
  LHASH_ITEM *next;
  size_t i;
  _LHASH *lh_local;
  
  if (lh != (_LHASH *)0x0) {
    for (next = (LHASH_ITEM *)0x0; next < (LHASH_ITEM *)lh->num_buckets;
        next = (LHASH_ITEM *)((long)&next->data + 1)) {
      local_28 = lh->buckets[(long)next];
      while (local_28 != (LHASH_ITEM *)0x0) {
        plVar1 = local_28->next;
        OPENSSL_free(local_28);
        local_28 = plVar1;
      }
    }
    OPENSSL_free(lh->buckets);
    OPENSSL_free(lh);
  }
  return;
}

Assistant:

void OPENSSL_lh_free(_LHASH *lh) {
  if (lh == NULL) {
    return;
  }

  for (size_t i = 0; i < lh->num_buckets; i++) {
    LHASH_ITEM *next;
    for (LHASH_ITEM *n = lh->buckets[i]; n != NULL; n = next) {
      next = n->next;
      OPENSSL_free(n);
    }
  }

  OPENSSL_free(lh->buckets);
  OPENSSL_free(lh);
}